

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall Array<String>::~Array(Array<String> *this)

{
  String *pSVar1;
  String *i;
  String *this_00;
  
  this_00 = (this->_begin).item;
  if (this_00 == (String *)0x0) {
    return;
  }
  pSVar1 = (this->_end).item;
  if (this_00 != pSVar1) {
    do {
      String::~String(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar1);
    this_00 = (this->_begin).item;
    if (this_00 == (String *)0x0) {
      return;
    }
  }
  operator_delete__(this_00);
  return;
}

Assistant:

~Array()
  {
    if(_begin.item)
    {
      for(T* i = _begin.item, * end = _end.item; i != end; ++i)
        i->~T();
      delete[] (char*)_begin.item;
    }
  }